

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::AddRepeatedFields1<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes *pTVar1;
  TestAllTypes_RepeatedGroup *this;
  TestAllTypes_NestedMessage *pTVar2;
  ForeignMessage *this_00;
  ImportMessage *this_01;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  allocator<char> local_89;
  string local_88;
  string_view local_68 [2];
  allocator<char> local_41;
  string local_40;
  string_view local_20;
  TestAllTypes *local_10;
  TestAllTypes *message_local;
  
  local_10 = message;
  proto2_unittest::TestAllTypes::add_repeated_int32(message,0xc9);
  proto2_unittest::TestAllTypes::add_repeated_int64(local_10,0xca);
  proto2_unittest::TestAllTypes::add_repeated_uint32(local_10,0xcb);
  proto2_unittest::TestAllTypes::add_repeated_uint64(local_10,0xcc);
  proto2_unittest::TestAllTypes::add_repeated_sint32(local_10,0xcd);
  proto2_unittest::TestAllTypes::add_repeated_sint64(local_10,0xce);
  proto2_unittest::TestAllTypes::add_repeated_fixed32(local_10,0xcf);
  proto2_unittest::TestAllTypes::add_repeated_fixed64(local_10,0xd0);
  proto2_unittest::TestAllTypes::add_repeated_sfixed32(local_10,0xd1);
  proto2_unittest::TestAllTypes::add_repeated_sfixed64(local_10,0xd2);
  proto2_unittest::TestAllTypes::add_repeated_float(local_10,211.0);
  proto2_unittest::TestAllTypes::add_repeated_double(local_10,212.0);
  proto2_unittest::TestAllTypes::add_repeated_bool(local_10,true);
  proto2_unittest::TestAllTypes::add_repeated_string<char_const(&)[4]>(local_10,(char (*) [4])"215")
  ;
  proto2_unittest::TestAllTypes::add_repeated_bytes<char_const(&)[4]>(local_10,(char (*) [4])"216");
  this = proto2_unittest::TestAllTypes::add_repeatedgroup(local_10);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(this,0xd9);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeated_nested_message(local_10);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0xda);
  this_00 = proto2_unittest::TestAllTypes::add_repeated_foreign_message(local_10);
  proto2_unittest::ForeignMessage::set_c(this_00,0xdb);
  this_01 = proto2_unittest::TestAllTypes::add_repeated_import_message(local_10);
  proto2_unittest_import::ImportMessage::set_d(this_01,0xdc);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeated_lazy_message(local_10);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0xe3);
  proto2_unittest::TestAllTypes::add_repeated_nested_enum(local_10,TestAllTypes_NestedEnum_BAR);
  proto2_unittest::TestAllTypes::add_repeated_foreign_enum(local_10,FOREIGN_BAR);
  proto2_unittest::TestAllTypes::add_repeated_import_enum(local_10,IMPORT_BAR);
  pRVar3 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"repeated_string_piece");
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"224",&local_41);
  Reflection::AddString(pRVar3,&pTVar1->super_Message,pFVar5,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pRVar3 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"repeated_cord")
  ;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_68[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"225",&local_89);
  Reflection::AddString(pRVar3,&pTVar1->super_Message,pFVar5,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void AddRepeatedFields1(TestAllTypes* message) {
  message->add_repeated_int32(201);
  message->add_repeated_int64(202);
  message->add_repeated_uint32(203);
  message->add_repeated_uint64(204);
  message->add_repeated_sint32(205);
  message->add_repeated_sint64(206);
  message->add_repeated_fixed32(207);
  message->add_repeated_fixed64(208);
  message->add_repeated_sfixed32(209);
  message->add_repeated_sfixed64(210);
  message->add_repeated_float(211);
  message->add_repeated_double(212);
  message->add_repeated_bool(true);
  message->add_repeated_string("215");
  message->add_repeated_bytes("216");

  message->add_repeatedgroup()->set_a(217);
  message->add_repeated_nested_message()->set_bb(218);
  message->add_repeated_foreign_message()->set_c(219);
  message->add_repeated_import_message()->set_d(220);
  message->add_repeated_lazy_message()->set_bb(227);

  message->add_repeated_nested_enum(TestAllTypes::BAR);
  message->add_repeated_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAR);
  message->add_repeated_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAR);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->AddString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"),
      "224");
  message->GetReflection()->AddString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"),
      "225");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}